

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_check_file_reopen(fdb_kvs_handle *handle,file_status_t *status)

{
  file_status_t fVar1;
  char *__src;
  fdb_file_handle *pfVar2;
  filemgr *pfVar3;
  uint64_t version;
  long lVar4;
  bool bVar5;
  fdb_status fVar6;
  fdb_status fVar7;
  fdb_status fVar8;
  undefined4 uVar9;
  undefined7 extraout_var;
  char cVar10;
  fdb_status fVar11;
  long alStack_5d0 [9];
  uint64_t local_588;
  uint64_t ndocs;
  undefined1 local_188 [8];
  fdb_config config;
  uint64_t ndeletes;
  uint64_t datasize;
  uint64_t nlivenodes;
  uint64_t last_wal_flush_hdr_bid;
  uint64_t kv_info_offset;
  uint64_t header_flags;
  size_t header_len;
  bid_t trie_root_bid;
  bid_t seq_root_bid;
  bid_t stale_root_bid;
  char *new_filename;
  
  fVar1 = (handle->file->status).super___atomic_base<unsigned_char>._M_i;
  fVar8 = FDB_RESULT_SUCCESS;
  if ((fVar1 != '\x04') ||
     (fVar8 = FDB_RESULT_SUCCESS, (handle->config).do_not_move_to_compacted_file != false))
  goto LAB_0011bd79;
  lVar4 = -((ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bbfe;
  memcpy(local_188,&handle->config,0xf8);
  if ((handle->config).compaction_mode == '\x01') {
    __src = handle->filename;
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bc1b;
    strcpy((char *)&local_588,__src);
    pfVar2 = handle->fhandle;
    pfVar3 = handle->file;
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bc28;
    bVar5 = filemgr_fhandle_remove(pfVar3,pfVar2);
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bc33;
    fVar6 = _fdb_close(handle);
    uVar9 = CONCAT31((int3)((uint)fVar6 >> 8),fVar6 == FDB_RESULT_SUCCESS);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      new_filename._4_4_ = uVar9;
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bd17;
      fVar8 = _fdb_open(handle,(char *)&local_588,FDB_VFILENAME,(fdb_config *)local_188);
      fVar11 = FDB_RESULT_SUCCESS;
      uVar9 = new_filename._4_4_;
      if (fVar8 == FDB_RESULT_SUCCESS) goto LAB_0011bd51;
      cVar10 = '\0';
      fVar7 = fVar8;
    }
    else {
      fVar11 = fVar6;
      if (bVar5) {
LAB_0011bd51:
        pfVar2 = handle->fhandle;
        pfVar3 = handle->file;
        *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bd61;
        filemgr_fhandle_add(pfVar3,pfVar2);
        cVar10 = (char)uVar9;
        fVar7 = fVar6;
        fVar8 = fVar11;
      }
      else {
LAB_0011bd47:
        cVar10 = '\0';
        fVar7 = fVar6;
        fVar8 = fVar6;
      }
    }
  }
  else {
    pfVar3 = handle->file;
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bc6c;
    filemgr_get_header(pfVar3,(void *)((long)&local_588 + lVar4),&header_flags,(bid_t *)0x0,
                       (fdb_seqnum_t *)0x0,(filemgr_header_revnum_t *)0x0);
    version = handle->file->version;
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0;
    *(bid_t **)((long)alStack_5d0 + lVar4 + 0x38) = &stale_root_bid;
    *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x30) = &kv_info_offset;
    *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x28) = &last_wal_flush_hdr_bid;
    *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x20) = &nlivenodes;
    *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x18) = &ndeletes;
    *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x10) = &datasize;
    *(uint32_t **)((long)alStack_5d0 + lVar4 + 8) = &config.num_blocks_readahead;
    *(undefined8 *)((long)alStack_5d0 + lVar4) = 0x11bcbd;
    fdb_fetch_header(version,(void *)((long)&local_588 + lVar4),&header_len,&trie_root_bid,
                     &seq_root_bid,&local_588,*(uint64_t **)((long)alStack_5d0 + lVar4 + 8),
                     *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x10),
                     *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x18),
                     *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x20),
                     *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x28),
                     *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x30),
                     *(char ***)((long)alStack_5d0 + lVar4 + 0x38),
                     *(char ***)((long)alStack_5d0 + lVar4 + 0x40));
    pfVar2 = handle->fhandle;
    pfVar3 = handle->file;
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bcce;
    bVar5 = filemgr_fhandle_remove(pfVar3,pfVar2);
    fVar7 = (fdb_status)CONCAT71(extraout_var,bVar5);
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bcd9;
    fVar8 = _fdb_close(handle);
    if (fVar8 == FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bd3d;
      fVar6 = _fdb_open(handle,(char *)stale_root_bid,FDB_AFILENAME,(fdb_config *)local_188);
      fVar8 = FDB_RESULT_SUCCESS;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bd47;
      pfVar2 = handle->fhandle;
      pfVar3 = handle->file;
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bd73;
      filemgr_fhandle_add(pfVar3,pfVar2);
      cVar10 = '\x01';
    }
    else {
      if (bVar5) {
        pfVar2 = handle->fhandle;
        pfVar3 = handle->file;
        *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11bcf2;
        filemgr_fhandle_add(pfVar3,pfVar2);
      }
      cVar10 = '\0';
      fVar7 = fVar8;
    }
  }
  if (cVar10 == '\0') {
    return fVar7;
  }
LAB_0011bd79:
  if (status != (file_status_t *)0x0) {
    *status = fVar1;
  }
  return fVar8;
}

Assistant:

fdb_status fdb_check_file_reopen(fdb_kvs_handle *handle, file_status_t *status)
{
    bool fhandle_ret;
    fdb_status fs = FDB_RESULT_SUCCESS;
    file_status_t fstatus = filemgr_get_file_status(handle->file);
    // check whether the compaction is done
    if ( fstatus == FILE_REMOVED_PENDING &&
         !handle->config.do_not_move_to_compacted_file ) {
        uint64_t ndocs, ndeletes, datasize, nlivenodes, last_wal_flush_hdr_bid;
        uint64_t kv_info_offset, header_flags;
        size_t header_len;
        char *new_filename;
        uint8_t *buf = alca(uint8_t, handle->config.blocksize);
        bid_t trie_root_bid, seq_root_bid, stale_root_bid;
        fdb_config config = handle->config;

        // close the current file and newly open the new file
        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // compaction daemon mode .. just close and then open
            char filename[FDB_MAX_FILENAME_LEN];
            strcpy(filename, handle->filename);

            // We don't need to maintain fhandle list for the old file
            // as there will be no more mutation on the file.
            fhandle_ret = filemgr_fhandle_remove(handle->file, handle->fhandle);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                if (fhandle_ret) {
                    filemgr_fhandle_add(handle->file, handle->fhandle);
                }
                return fs;
            }

            fs = _fdb_open(handle, filename, FDB_VFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            filemgr_fhandle_add(handle->file, handle->fhandle);

        } else {
            // Manual compaction.
            filemgr_get_header(handle->file, buf, &header_len, NULL, NULL, NULL);
            fdb_fetch_header(handle->file->version, buf,
                             &trie_root_bid, &seq_root_bid, &stale_root_bid,
                             &ndocs, &ndeletes, &nlivenodes, &datasize,
                             &last_wal_flush_hdr_bid,
                             &kv_info_offset, &header_flags,
                             &new_filename, NULL);

            fhandle_ret = filemgr_fhandle_remove(handle->file, handle->fhandle);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                if (fhandle_ret) {
                    filemgr_fhandle_add(handle->file, handle->fhandle);
                }
                return fs;
            }

            fs = _fdb_open(handle, new_filename, FDB_AFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            filemgr_fhandle_add(handle->file, handle->fhandle);
        }
    }
    if (status) {
        *status = fstatus;
    }
    return fs;
}